

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debuginfo.cpp
# Opt level: O0

int32_t __thiscall DebugInfo::GetObjectFileIndex(DebugInfo *this,char *pathStr)

{
  bool bVar1;
  pointer ppVar2;
  size_type sVar3;
  mapped_type *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
  local_140;
  const_iterator local_118;
  int32_t local_10c;
  undefined1 local_108 [4];
  int32_t index;
  ObjectFileInfo info;
  string file;
  string local_90 [8];
  string dir;
  _Self local_68;
  _Self local_60;
  iterator it;
  allocator local_41;
  string local_40 [8];
  string path;
  char *pathStr_local;
  DebugInfo *this_local;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_40,pathStr,&local_41);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  local_60._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::find(&this->m_ObjectPathToIndex,(key_type *)local_40);
  local_68._M_node =
       (_Base_ptr)
       std::
       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
       ::end(&this->m_ObjectPathToIndex);
  bVar1 = std::operator!=(&local_60,&local_68);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
             ::operator->(&local_60);
    this_local._4_4_ = ppVar2->second;
  }
  else {
    std::__cxx11::string::string(local_90);
    std::__cxx11::string::string((string *)&info.contribDataSize);
    splitPath((string *)local_40,(string *)local_90,(string *)&info.contribDataSize);
    ObjectFileInfo::ObjectFileInfo((ObjectFileInfo *)local_108);
    std::__cxx11::string::operator=((string *)local_108,local_90);
    std::__cxx11::string::operator=((string *)&info.field_0x18,(string *)&info.contribDataSize);
    sVar3 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size(&this->m_ObjectPathToIndex);
    local_10c = (int32_t)sVar3;
    info._56_4_ = local_10c;
    std::vector<ObjectFileInfo,std::allocator<ObjectFileInfo>>::emplace_back<ObjectFileInfo&>
              ((vector<ObjectFileInfo,std::allocator<ObjectFileInfo>> *)&this->m_ObjectFiles,
               (ObjectFileInfo *)local_108);
    std::
    _Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
    ::_Rb_tree_const_iterator(&local_118,&local_60);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_int_&,_true>
              (&local_140,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
               &local_10c);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
    ::insert(&this->m_ObjectPathToIndex,local_118,&local_140);
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
    ::~pair(&local_140);
    this_00 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::operator[](&this->m_ObjectNameToFolders,(key_type *)&info.contribDataSize);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(this_00,(value_type *)local_90);
    this_local._4_4_ = local_10c;
    ObjectFileInfo::~ObjectFileInfo((ObjectFileInfo *)local_108);
    std::__cxx11::string::~string((string *)&info.contribDataSize);
    std::__cxx11::string::~string(local_90);
  }
  std::__cxx11::string::~string(local_40);
  return this_local._4_4_;
}

Assistant:

int32_t DebugInfo::GetObjectFileIndex(const char* pathStr)
{
    std::string path = pathStr;
    auto it = m_ObjectPathToIndex.find(path);
    if (it != m_ObjectPathToIndex.end())
        return it->second;

    std::string dir, file;
    splitPath(path, dir, file);

    ObjectFileInfo info;
    info.fileDir = dir;
    info.fileName = file;

    int32_t index = int32_t(m_ObjectPathToIndex.size());
    info.index = index;

    m_ObjectFiles.emplace_back(info);
    m_ObjectPathToIndex.insert(it, {path, index});
    m_ObjectNameToFolders[file].insert(dir);
    return index;
}